

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc
                  (mz_zip_archive *pZip,char *pFilename,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  mz_uint local_44;
  void *pvStack_40;
  mz_uint32 file_index;
  void *pUser_read_buf_local;
  size_t sStack_30;
  mz_uint flags_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  pvStack_40 = pUser_read_buf;
  pUser_read_buf_local._4_4_ = flags;
  sStack_30 = buf_size;
  buf_size_local = (size_t)pBuf;
  pBuf_local = pFilename;
  pFilename_local = (char *)pZip;
  mVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&local_44);
  if (mVar1 == 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    pZip_local._4_4_ =
         mz_zip_reader_extract_to_mem_no_alloc1
                   ((mz_zip_archive *)pFilename_local,local_44,(void *)buf_size_local,sStack_30,
                    pUser_read_buf_local._4_4_,pvStack_40,user_read_buf_size,
                    (mz_zip_archive_file_stat *)0x0);
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc(
    mz_zip_archive *pZip, const char *pFilename, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size) {
  mz_uint32 file_index;
  if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
    return MZ_FALSE;
  return mz_zip_reader_extract_to_mem_no_alloc1(pZip, file_index, pBuf,
                                                buf_size, flags, pUser_read_buf,
                                                user_read_buf_size, NULL);
}